

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

void xmlCompileAttributeTest(xmlPatParserContextPtr ctxt)

{
  int iVar1;
  bool bVar2;
  xmlChar *prefix;
  xmlChar *pxStack_28;
  int i;
  xmlChar *URL;
  xmlChar *name;
  xmlChar *token;
  xmlPatParserContextPtr ctxt_local;
  
  name = (xmlChar *)0x0;
  pxStack_28 = (xmlChar *)0x0;
  while( true ) {
    bVar2 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
      bVar2 = *ctxt->cur == '\r';
    }
    if (!bVar2) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  URL = xmlPatScanNCName(ctxt);
  if (ctxt->error < 0) {
    return;
  }
  if (URL == (xmlChar *)0x0) {
    if (*ctxt->cur != '*') {
      ctxt->error = 1;
      return;
    }
    iVar1 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ATTR,(xmlChar *)0x0,(xmlChar *)0x0);
    if (iVar1 == 0) {
      if (*ctxt->cur == '\0') {
        return;
      }
      ctxt->cur = ctxt->cur + 1;
      return;
    }
  }
  else {
    if (*ctxt->cur == ':') {
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      if ((*ctxt->cur == ' ') || (((8 < *ctxt->cur && (*ctxt->cur < 0xb)) || (*ctxt->cur == '\r'))))
      {
        ctxt->error = 1;
        goto LAB_001a8c31;
      }
      name = xmlPatScanName(ctxt);
      if (((*URL == 'x') && (URL[1] == 'm')) && ((URL[2] == 'l' && (URL[3] == '\0')))) {
        if (ctxt->comp->dict == (xmlDictPtr)0x0) {
          pxStack_28 = xmlStrdup((xmlChar *)"http://www.w3.org/XML/1998/namespace");
        }
        else {
          pxStack_28 = xmlDictLookup(ctxt->comp->dict,
                                     (xmlChar *)"http://www.w3.org/XML/1998/namespace",-1);
        }
      }
      else {
        for (prefix._4_4_ = 0; prefix._4_4_ < ctxt->nb_namespaces; prefix._4_4_ = prefix._4_4_ + 1)
        {
          iVar1 = xmlStrEqual(ctxt->namespaces[prefix._4_4_ * 2 + 1],URL);
          if (iVar1 != 0) {
            if (ctxt->comp->dict == (xmlDictPtr)0x0) {
              pxStack_28 = xmlStrdup(ctxt->namespaces[prefix._4_4_ << 1]);
            }
            else {
              pxStack_28 = xmlDictLookup(ctxt->comp->dict,ctxt->namespaces[prefix._4_4_ << 1],-1);
            }
            break;
          }
        }
        if (ctxt->nb_namespaces <= prefix._4_4_) {
          ctxt->error = 1;
          goto LAB_001a8c31;
        }
      }
      if (ctxt->comp->dict == (xmlDictPtr)0x0) {
        (*xmlFree)(URL);
      }
      URL = (xmlChar *)0x0;
      if (name == (xmlChar *)0x0) {
        if (*ctxt->cur != '*') {
          ctxt->error = 1;
          goto LAB_001a8c31;
        }
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
        iVar1 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ATTR,(xmlChar *)0x0,pxStack_28);
      }
      else {
        iVar1 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ATTR,name,pxStack_28);
      }
    }
    else {
      iVar1 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ATTR,URL,(xmlChar *)0x0);
    }
    if (iVar1 == 0) {
      return;
    }
  }
LAB_001a8c31:
  if ((URL != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(URL);
  }
  if ((pxStack_28 != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(pxStack_28);
  }
  if ((name != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(name);
  }
  return;
}

Assistant:

static void
xmlCompileAttributeTest(xmlPatParserContextPtr ctxt) {
    xmlChar *token = NULL;
    xmlChar *name = NULL;
    xmlChar *URL = NULL;

    SKIP_BLANKS;
    name = xmlPatScanNCName(ctxt);
    if (ctxt->error < 0)
        return;
    if (name == NULL) {
	if (CUR == '*') {
	    PUSH(XML_OP_ATTR, NULL, NULL);
	    NEXT;
	} else {
	    ERROR(NULL, NULL, NULL,
		"xmlCompileAttributeTest : Name expected\n");
	    ctxt->error = 1;
	}
	return;
    }
    if (CUR == ':') {
	int i;
	xmlChar *prefix = name;

	NEXT;

	if (IS_BLANK_CH(CUR)) {
	    ERROR5(NULL, NULL, NULL, "Invalid QName.\n", NULL);
	    ctxt->error = 1;
	    goto error;
	}
	/*
	* This is a namespace match
	*/
	token = xmlPatScanName(ctxt);
	if ((prefix[0] == 'x') &&
	    (prefix[1] == 'm') &&
	    (prefix[2] == 'l') &&
	    (prefix[3] == 0))
	{
	    XML_PAT_COPY_NSNAME(ctxt, URL, XML_XML_NAMESPACE);
	} else {
	    for (i = 0;i < ctxt->nb_namespaces;i++) {
		if (xmlStrEqual(ctxt->namespaces[2 * i + 1], prefix)) {
		    XML_PAT_COPY_NSNAME(ctxt, URL, ctxt->namespaces[2 * i])
		    break;
		}
	    }
	    if (i >= ctxt->nb_namespaces) {
		ERROR5(NULL, NULL, NULL,
		    "xmlCompileAttributeTest : no namespace bound to prefix %s\n",
		    prefix);
		ctxt->error = 1;
		goto error;
	    }
	}
        XML_PAT_FREE_STRING(ctxt, name);
        name = NULL;
	if (token == NULL) {
	    if (CUR == '*') {
		NEXT;
		PUSH(XML_OP_ATTR, NULL, URL);
	    } else {
		ERROR(NULL, NULL, NULL,
		    "xmlCompileAttributeTest : Name expected\n");
		ctxt->error = 1;
		goto error;
	    }
	} else {
	    PUSH(XML_OP_ATTR, token, URL);
	}
    } else {
	PUSH(XML_OP_ATTR, name, NULL);
    }
    return;
error:
    if (name != NULL)
	XML_PAT_FREE_STRING(ctxt, name);
    if (URL != NULL)
	XML_PAT_FREE_STRING(ctxt, URL)
    if (token != NULL)
	XML_PAT_FREE_STRING(ctxt, token);
}